

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall cmFileCopier::CheckPermissions(cmFileCopier *this,string *arg,mode_t *permissions)

{
  cmCommand *this_00;
  int iVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  iVar1 = std::__cxx11::string::compare((char *)arg);
  if (iVar1 == 0) {
    *(byte *)((long)permissions + 1) = *(byte *)((long)permissions + 1) | 1;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)arg);
    if (iVar1 == 0) {
      *(byte *)permissions = (byte)*permissions | 0x80;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)arg);
      if (iVar1 == 0) {
        *(byte *)permissions = (byte)*permissions | 0x40;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)arg);
        if (iVar1 == 0) {
          *(byte *)permissions = (byte)*permissions | 0x20;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)arg);
          if (iVar1 == 0) {
            *(byte *)permissions = (byte)*permissions | 0x10;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)arg);
            if (iVar1 == 0) {
              *(byte *)permissions = (byte)*permissions | 8;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)arg);
              if (iVar1 == 0) {
                *(byte *)permissions = (byte)*permissions | 4;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)arg);
                if (iVar1 == 0) {
                  *(byte *)permissions = (byte)*permissions | 2;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)arg);
                  if (iVar1 == 0) {
                    *(byte *)permissions = (byte)*permissions | 1;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)arg);
                    if (iVar1 == 0) {
                      *(byte *)((long)permissions + 1) = *(byte *)((long)permissions + 1) | 8;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)arg);
                      if (iVar1 != 0) {
                        std::__cxx11::ostringstream::ostringstream(local_190);
                        poVar2 = std::operator<<((ostream *)local_190,this->Name);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar2," given invalid permission \"",0x1b);
                        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar2,(arg->_M_dataplus)._M_p,arg->_M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".",2);
                        this_00 = &this->FileCommand->super_cmCommand;
                        std::__cxx11::stringbuf::str();
                        cmCommand::SetError(this_00,&local_1b0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                          operator_delete(local_1b0._M_dataplus._M_p,
                                          local_1b0.field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::ostringstream::~ostringstream(local_190);
                        std::ios_base::~ios_base(local_120);
                        return false;
                      }
                      *(byte *)((long)permissions + 1) = *(byte *)((long)permissions + 1) | 4;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool CheckPermissions(std::string const& arg, mode_t& permissions)
    {
    if(arg == "OWNER_READ")         { permissions |= mode_owner_read; }
    else if(arg == "OWNER_WRITE")   { permissions |= mode_owner_write; }
    else if(arg == "OWNER_EXECUTE") { permissions |= mode_owner_execute; }
    else if(arg == "GROUP_READ")    { permissions |= mode_group_read; }
    else if(arg == "GROUP_WRITE")   { permissions |= mode_group_write; }
    else if(arg == "GROUP_EXECUTE") { permissions |= mode_group_execute; }
    else if(arg == "WORLD_READ")    { permissions |= mode_world_read; }
    else if(arg == "WORLD_WRITE")   { permissions |= mode_world_write; }
    else if(arg == "WORLD_EXECUTE") { permissions |= mode_world_execute; }
    else if(arg == "SETUID")        { permissions |= mode_setuid; }
    else if(arg == "SETGID")        { permissions |= mode_setgid; }
    else
      {
      std::ostringstream e;
      e << this->Name << " given invalid permission \"" << arg << "\".";
      this->FileCommand->SetError(e.str());
      return false;
      }
    return true;
    }